

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Last.hpp
# Opt level: O2

OUT * __thiscall
linq::Last<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
          (OUT *__return_storage_ptr__,linq *this,
          GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  char cVar2;
  out_of_range *this_00;
  OUT result;
  
  (*(code *)**(undefined8 **)this)(this);
  cVar2 = (**(code **)(*(long *)this + 8))(this);
  if (cVar2 == '\0') {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"this");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  while( true ) {
    (**(code **)(*(long *)this + 0x18))(&result,this);
    (**(code **)(*(long *)this + 0x10))(this);
    cVar2 = (**(code **)(*(long *)this + 8))(this);
    _Var1 = result.super_IEnumerable<int_&>.state.
            super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (cVar2 == '\0') break;
    IEnumerable<int_&>::~IEnumerable(&result.super_IEnumerable<int_&>);
  }
  result.super_IEnumerable<int_&>.state.
  super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_IEnumerable<int_&>).state.
  super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       result.super_IEnumerable<int_&>.state.
       super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->super_IEnumerable<int_&>).state.
  super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  result.super_IEnumerable<int_&>.state.
  super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_0013e648;
  __return_storage_ptr__->Key = result.Key;
  IEnumerable<int_&>::~IEnumerable(&result.super_IEnumerable<int_&>);
  return __return_storage_ptr__;
}

Assistant:

auto Last(S&& source)
	{
		source.Init();
		if(!source.Valid())
			throw std::out_of_range("this");

		while(true)
		{
			auto result = source.Current();
			source.Advance();

			if(!source.Valid())
				return result;
		}
	}